

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.cpp
# Opt level: O0

vector<std::any,_std::allocator<std::any>_> * __thiscall
Json::init_array_contents
          (vector<std::any,_std::allocator<std::any>_> *__return_storage_ptr__,Json *this,string *s,
          size_t start)

{
  undefined8 uVar1;
  _Base_ptr p_Var2;
  char *pcVar3;
  undefined1 local_58 [24];
  size_t i;
  any value;
  size_t start_local;
  string *s_local;
  Json *this_local;
  vector<std::any,_std::allocator<std::any>_> *result;
  
  value._M_storage._7_1_ = 0;
  std::vector<std::any,_std::allocator<std::any>_>::vector(__return_storage_ptr__);
  std::any::any((any *)&i);
  for (local_58._16_8_ = start; uVar1 = local_58._16_8_,
      p_Var2 = (_Base_ptr)std::__cxx11::string::size(), (ulong)uVar1 < p_Var2;
      local_58._16_8_ = (long)(_Rb_tree_color *)local_58._16_8_ + 1) {
    init_right_of_pair((Json *)local_58,(string *)this,(size_t *)s);
    std::any::operator=((any *)&i,(any *)local_58);
    std::any::~any((any *)local_58);
    std::vector<std::any,_std::allocator<std::any>_>::push_back(__return_storage_ptr__,(any *)&i);
    pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)s);
    if (*pcVar3 == ']') break;
    pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)s);
    JsonTools::expect_(*pcVar3,',');
  }
  value._M_storage._7_1_ = 1;
  std::any::~any((any *)&i);
  if ((value._M_storage._7_1_ & 1) == 0) {
    std::vector<std::any,_std::allocator<std::any>_>::~vector(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

vector<any> Json::init_array_contents(string& s, size_t start){
	vector<any> result;
	any value;
	for (size_t i = start; i < s.size(); ++i) {
		value = init_right_of_pair(s, i);
		result.push_back(value);
		if (s[i] == ']') break;
		else JsonTools::expect_(s[i], ',');
	}
	return result;
}